

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampFormatCase::init
          (TextureBorderClampFormatCase *this,EVP_PKEY_CTX *ctx)

{
  float (*pafVar1) [2];
  undefined8 *puVar2;
  float *pfVar3;
  deUint32 dVar4;
  pointer pIVar5;
  int iVar6;
  long lVar7;
  int ndx;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  GenericVec4 GVar13;
  TextureFormat texFormat;
  Vec4 local_f8;
  IterationConfig iteration;
  TextureFormatInfo texFormatInfo;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  texFormat = tcu::getEffectiveDepthStencilTextureFormat
                        ((TextureFormat *)
                         &((this->super_TextureBorderClampTest).m_texture.
                           super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                           m_data.ptr)->m_refTexture,
                         (this->super_TextureBorderClampTest).m_sampleMode);
  tcu::getTextureFormatInfo(&texFormatInfo,&texFormat);
  TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
  iteration.p0.m_data[0] = -1.5;
  iteration.p0.m_data[1] = -3.0;
  iteration.p1.m_data[0] = 1.5;
  iteration.p1.m_data[1] = 2.5;
  local_f8.m_data[0] = 0.3;
  local_f8.m_data[1] = 0.7;
  local_f8.m_data[2] = 0.2;
  local_f8.m_data[3] = 0.5;
  GVar13 = mapToFormatColorRepresentable(&texFormat,&local_f8);
  iteration.borderColor.v.uData[0] = GVar13.v._0_4_;
  iteration.borderColor.v.uData[1] = GVar13.v._4_4_;
  iteration.borderColor.v.uData[2] = GVar13.v._8_4_;
  iteration.borderColor.v.uData[3] = GVar13.v._12_4_;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,&iteration);
  std::__cxx11::string::~string((string *)&iteration.description);
  TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
  iteration.p0.m_data[0] = -0.5;
  iteration.p0.m_data[1] = 0.75;
  iteration.p1.m_data[0] = 0.25;
  iteration.p1.m_data[1] = 1.25;
  local_f8.m_data[0] = 0.9;
  local_f8.m_data[1] = 0.2;
  local_f8.m_data[2] = 0.4;
  local_f8.m_data[3] = 0.6;
  GVar13 = mapToFormatColorRepresentable(&texFormat,&local_f8);
  iteration.borderColor.v.uData[0] = GVar13.v._0_4_;
  iteration.borderColor.v.uData[1] = GVar13.v._4_4_;
  iteration.borderColor.v.uData[2] = GVar13.v._8_4_;
  iteration.borderColor.v.uData[3] = GVar13.v._12_4_;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,&iteration);
  std::__cxx11::string::~string((string *)&iteration.description);
  lVar7 = 0x74;
  lVar8 = 0;
  while( true ) {
    pIVar5 = (this->m_iterations).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = (int)(((long)(this->m_iterations).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5) / 0x78);
    if (iVar6 <= lVar8) break;
    if ((this->super_TextureBorderClampTest).m_samplingFunction == SAMPLE_GATHER) {
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&iteration,texFormatInfo.lookupScale.m_data[0]);
      pafVar1 = (float (*) [2])((long)(pIVar5->p0).m_data + lVar7 + -0x54);
      *pafVar1 = iteration.p0.m_data;
      pafVar1[1] = iteration.p1.m_data;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&iteration,texFormatInfo.lookupBias.m_data[0]);
      fVar9 = iteration.p0.m_data[0];
      fVar10 = iteration.p0.m_data[1];
      fVar11 = iteration.p1.m_data[0];
      fVar12 = iteration.p1.m_data[1];
    }
    else {
      puVar2 = (undefined8 *)((long)(pIVar5->p0).m_data + lVar7 + -0x54);
      *puVar2 = CONCAT44(texFormatInfo.lookupScale.m_data[1],texFormatInfo.lookupScale.m_data[0]);
      puVar2[1] = texFormatInfo.lookupScale.m_data._8_8_;
      fVar9 = texFormatInfo.lookupBias.m_data[0];
      fVar10 = texFormatInfo.lookupBias.m_data[1];
      fVar11 = texFormatInfo.lookupBias.m_data[2];
      fVar12 = texFormatInfo.lookupBias.m_data[3];
    }
    pfVar3 = (float *)((long)(pIVar5->p0).m_data + lVar7 + -0x44);
    *pfVar3 = fVar9;
    pfVar3[1] = fVar10;
    pfVar3[2] = fVar11;
    pfVar3[3] = fVar12;
    dVar4 = this->m_filter;
    *(deUint32 *)((long)(pIVar5->p0).m_data + lVar7 + -0x34) = dVar4;
    *(deUint32 *)((long)(&pIVar5->p0 + -6) + lVar7) = dVar4;
    puVar2 = (undefined8 *)((long)(pIVar5->p0).m_data + lVar7 + -0xc);
    *puVar2 = 0x812d0000812d;
    puVar2[1] = 0;
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x78;
  }
  return iVar6;
}

Assistant:

void TextureBorderClampFormatCase::init (void)
{
	TextureBorderClampTest::init();

	// \note TextureBorderClampTest::init() creates texture
	const tcu::TextureFormat		texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const tcu::TextureFormatInfo	texFormatInfo	= tcu::getTextureFormatInfo(texFormat);

	// iterations

	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-1.5f, -3.0f);
		iteration.p1			= tcu::Vec2( 1.5f,  2.5f);
		iteration.borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.3f, 0.7f, 0.2f, 0.5f));
		m_iterations.push_back(iteration);
	}
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.5f, 0.75f);
		iteration.p1			= tcu::Vec2(0.25f, 1.25f);
		iteration.borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.9f, 0.2f, 0.4f, 0.6f));
		m_iterations.push_back(iteration);
	}

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		if (m_samplingFunction == SAMPLE_GATHER)
		{
			iteration.lookupScale	= tcu::Vec4(texFormatInfo.lookupScale.x());
			iteration.lookupBias	= tcu::Vec4(texFormatInfo.lookupBias.x());
		}
		else
		{
			iteration.lookupScale	= texFormatInfo.lookupScale;
			iteration.lookupBias	= texFormatInfo.lookupBias;
		}

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}